

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O0

UObject * __thiscall
icu_63::ICULocaleService::get
          (ICULocaleService *this,Locale *locale,int32_t kind,Locale *actualReturn,
          UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  char *src;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_d8 [8];
  UnicodeString temp;
  ICUServiceKey *key;
  undefined1 local_80 [8];
  UnicodeString locName;
  UObject *result;
  UErrorCode *status_local;
  Locale *actualReturn_local;
  int32_t kind_local;
  Locale *locale_local;
  ICULocaleService *this_local;
  
  locName.fUnion._48_8_ = 0;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    src = Locale::getName(locale);
    UnicodeString::UnicodeString((UnicodeString *)local_80,src,-1,kInvariant);
    UVar1 = UnicodeString::isBogus((UnicodeString *)local_80);
    if (UVar1 == '\0') {
      iVar2 = (*(this->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[0x17])
                        (this,local_80,(ulong)(uint)kind,status);
      temp.fUnion._48_8_ = CONCAT44(extraout_var,iVar2);
      if ((ICUServiceKey *)temp.fUnion._48_8_ != (ICUServiceKey *)0x0) {
        if (actualReturn == (Locale *)0x0) {
          locName.fUnion._48_8_ =
               ICUService::getKey(&this->super_ICUService,(ICUServiceKey *)temp.fUnion._48_8_,status
                                 );
        }
        else {
          UnicodeString::UnicodeString((UnicodeString *)local_d8);
          iVar2 = (*(this->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[7])
                            (this,temp.fUnion._48_8_,local_d8,status);
          locName.fUnion._48_8_ = CONCAT44(extraout_var_00,iVar2);
          if (locName.fUnion._48_8_ != 0) {
            ICUServiceKey::parseSuffix((UnicodeString *)local_d8);
            LocaleUtility::initLocaleFromName((UnicodeString *)local_d8,actualReturn);
          }
          UnicodeString::~UnicodeString((UnicodeString *)local_d8);
        }
        if (temp.fUnion._48_8_ != 0) {
          (**(code **)(*(long *)temp.fUnion._48_8_ + 8))();
        }
      }
    }
    else {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    this_local = (ICULocaleService *)locName.fUnion._48_8_;
    UnicodeString::~UnicodeString((UnicodeString *)local_80);
  }
  else {
    this_local = (ICULocaleService *)locName.fUnion._48_8_;
  }
  return (UObject *)this_local;
}

Assistant:

UObject*
ICULocaleService::get(const Locale& locale, int32_t kind, Locale* actualReturn, UErrorCode& status) const
{
    UObject* result = NULL;
    if (U_FAILURE(status)) {
        return result;
    }

    UnicodeString locName(locale.getName(), -1, US_INV);
    if (locName.isBogus()) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        ICUServiceKey* key = createKey(&locName, kind, status);
        if (key) {
            if (actualReturn == NULL) {
                result = getKey(*key, status);
            } else {
                UnicodeString temp;
                result = getKey(*key, &temp, status);

                if (result != NULL) {
                    key->parseSuffix(temp);
                    LocaleUtility::initLocaleFromName(temp, *actualReturn);
                }
            }
            delete key;
        }
    }
    return result;
}